

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O2

int __thiscall Zuker::fill_rna(Zuker *this,int index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  int (*paiVar12) [3];
  ulong uVar13;
  int *piVar14;
  bool bVar15;
  double dVar16;
  
  if (index % 3 == 1) {
    piVar6 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar10 = (uint *)(piVar6 + index);
    puVar11 = (uint *)(piVar6 + (long)index + -1);
    piVar14 = piVar6 + (long)index + 1;
  }
  else if (index % 3 == 0) {
    piVar6 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar11 = (uint *)(piVar6 + index);
    puVar10 = (uint *)(piVar6 + (long)index + 1);
    piVar14 = piVar6 + (long)index + 2;
  }
  else {
    piVar6 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar14 = piVar6 + index;
    puVar11 = (uint *)(piVar6 + (long)index + -2);
    puVar10 = (uint *)(piVar6 + (long)index + -1);
  }
  uVar1 = *puVar11;
  uVar2 = *puVar10;
  iVar3 = *piVar14;
  iVar4 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[index / 3];
  uVar5 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar4];
  bVar15 = (int)(uVar1 | uVar2) < 0;
  if ((bVar15) || (iVar3 < 0)) {
    if (bVar15) {
      if (((int)uVar2 < 0) || (iVar3 < 0)) {
        if (((int)uVar1 < 0) || (iVar3 < 0)) {
          if ((int)uVar1 < 0) {
            if ((int)uVar2 < 0) {
              if (iVar3 < 0) {
                iVar7 = max_cai_pos[iVar4];
              }
              else {
                uVar13 = 0;
                uVar9 = (ulong)uVar5;
                if ((int)uVar5 < 1) {
                  uVar9 = uVar13;
                }
                piVar14 = nucleotides[iVar4][0] + 2;
                dVar16 = -10000000.0;
                uVar8 = 0;
                for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
                  if ((*piVar14 == iVar3) && (dVar16 < codon_cai[iVar4][uVar13])) {
                    uVar8 = uVar13 & 0xffffffff;
                    dVar16 = codon_cai[iVar4][uVar13];
                  }
                  piVar14 = piVar14 + 3;
                }
              }
            }
            else {
              uVar13 = 0;
              uVar9 = (ulong)uVar5;
              if ((int)uVar5 < 1) {
                uVar9 = uVar13;
              }
              piVar14 = nucleotides[iVar4][0] + 1;
              dVar16 = -10000000.0;
              uVar8 = 0;
              for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
                if ((*piVar14 == uVar2) && (dVar16 < codon_cai[iVar4][uVar13])) {
                  uVar8 = uVar13 & 0xffffffff;
                  dVar16 = codon_cai[iVar4][uVar13];
                }
                piVar14 = piVar14 + 3;
              }
            }
          }
          else {
            uVar13 = 0;
            uVar9 = (ulong)uVar5;
            if ((int)uVar5 < 1) {
              uVar9 = uVar13;
            }
            paiVar12 = nucleotides[iVar4];
            dVar16 = -10000000.0;
            uVar8 = 0;
            for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
              if (((*(int (*) [3])*paiVar12)[0] == uVar1) && (dVar16 < codon_cai[iVar4][uVar13])) {
                uVar8 = uVar13 & 0xffffffff;
                dVar16 = codon_cai[iVar4][uVar13];
              }
              paiVar12 = paiVar12 + 1;
            }
          }
        }
        else {
          uVar13 = 0;
          uVar9 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar9 = uVar13;
          }
          piVar14 = nucleotides[iVar4][0] + 2;
          dVar16 = -10000000.0;
          uVar8 = 0;
          for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
            if ((((*(int (*) [3])(piVar14 + -2))[0] == uVar1) && (*piVar14 == iVar3)) &&
               (dVar16 < codon_cai[iVar4][uVar13])) {
              uVar8 = uVar13 & 0xffffffff;
              dVar16 = codon_cai[iVar4][uVar13];
            }
            piVar14 = piVar14 + 3;
          }
        }
      }
      else {
        uVar13 = 0;
        uVar9 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar9 = uVar13;
        }
        piVar14 = nucleotides[iVar4][0] + 2;
        dVar16 = -10000000.0;
        uVar8 = 0;
        for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
          if (((piVar14[-1] == uVar2) && (*piVar14 == iVar3)) && (dVar16 < codon_cai[iVar4][uVar13])
             ) {
            uVar8 = uVar13 & 0xffffffff;
            dVar16 = codon_cai[iVar4][uVar13];
          }
          piVar14 = piVar14 + 3;
        }
      }
    }
    else {
      uVar13 = 0;
      uVar9 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar9 = uVar13;
      }
      piVar14 = nucleotides[iVar4][0] + 1;
      dVar16 = -10000000.0;
      uVar8 = 0;
      for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
        if ((((*(int (*) [3])(piVar14 + -1))[0] == uVar1) && (*piVar14 == uVar2)) &&
           (dVar16 < codon_cai[iVar4][uVar13])) {
          uVar8 = uVar13 & 0xffffffff;
          dVar16 = codon_cai[iVar4][uVar13];
        }
        piVar14 = piVar14 + 3;
      }
    }
  }
  else {
    uVar13 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar13;
    }
    piVar14 = nucleotides[iVar4][0] + 2;
    dVar16 = -10000000.0;
    uVar8 = 0;
    for (; iVar7 = (int)uVar8, uVar9 != uVar13; uVar13 = uVar13 + 1) {
      if (((((*(int (*) [3])(piVar14 + -2))[0] == uVar1) && (piVar14[-1] == uVar2)) &&
          (*piVar14 == iVar3)) && (dVar16 < codon_cai[iVar4][uVar13])) {
        uVar8 = uVar13 & 0xffffffff;
        dVar16 = codon_cai[iVar4][uVar13];
      }
      piVar14 = piVar14 + 3;
    }
  }
  return iVar7;
}

Assistant:

int Zuker::fill_rna(int index) {
    int l0, l1, l2;
    if (index % 3 == 0) {
        l0 = nucle_seq[index];
        l1 = nucle_seq[index+1];
        l2 = nucle_seq[index+2];
    } else if (index % 3 == 1) {
        l0 = nucle_seq[index-1];
        l1 = nucle_seq[index];
        l2 = nucle_seq[index+1];
    } else {
        l0 = nucle_seq[index-2];
        l1 = nucle_seq[index-1];
        l2 = nucle_seq[index];
    }
    int pi = protein[index/3];
    int n_codon_pi = n_codon[pi];
    double max_cai = -INF;
    int idx = 0;
    // all three nucleotides in codon are specified
    if (l0 >=0 && l1 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][1] == l1 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the first two nucleotides in codon are specified
    else if (l0 >=0 && l1 >= 0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][1] == l1) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the last two nucleotides in codon are specified
    else if (l1 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][1] == l1 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // the first and the last nucleotides in codon are specified
    else if (l0 >= 0 && l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0 && nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the first nucleotide in codon is specified
    else if (l0 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][0] == l0) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the second nucleotide in codon is specified
    else if (l1 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][1] == l1) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    }
        // only the third nucleotide in codon is specified
    else if (l2 >=0) {
        for (int i = 0; i < n_codon_pi; ++i) {
            if (nucleotides[pi][i][2] == l2) {
                if (max_cai < codon_cai[pi][i]) {
                    max_cai = codon_cai[pi][i];
                    idx = i;
                }
            }
        }
        return idx;
    } else {
        return max_cai_pos[pi];
    }
}